

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTransport.h
# Opt level: O2

uint32_t duckdb_apache::thrift::transport::readAll<duckdb_apache::thrift::transport::TTransport>
                   (TTransport *trans,uint8_t *buf,uint32_t len)

{
  uint32_t get;
  int iVar1;
  TTransportException *this;
  uint uVar2;
  allocator local_41;
  string local_40;
  
  uVar2 = 0;
  do {
    if (len <= uVar2) {
      return uVar2;
    }
    iVar1 = (*trans->_vptr_TTransport[6])(trans,buf + uVar2);
    uVar2 = uVar2 + iVar1;
  } while (iVar1 != 0);
  this = (TTransportException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_40,"No more data to read.",&local_41);
  TTransportException::TTransportException(this,END_OF_FILE,&local_40);
  __cxa_throw(this,&TTransportException::typeinfo,TException::~TException);
}

Assistant:

uint32_t readAll(Transport_& trans, uint8_t* buf, uint32_t len) {
  uint32_t have = 0;
  uint32_t get = 0;

  while (have < len) {
    get = trans.read(buf + have, len - have);
    if (get <= 0) {
      throw TTransportException(TTransportException::END_OF_FILE, "No more data to read.");
    }
    have += get;
  }

  return have;
}